

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::ParseVarList(WastParser *this,VarVector *out_var_list)

{
  bool bVar1;
  Result RVar2;
  allocator local_f9;
  Location local_f8;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  Var var;
  Var local_78;
  
  local_f8.field_1.field_0.line = 0;
  local_f8.field_1._4_8_ = 0;
  local_f8.filename.data_ = (char *)0x0;
  local_f8.filename.size_._0_4_ = 0;
  local_f8.filename.size_._4_4_ = 0;
  Var::Var(&var,0xffffffff,&local_f8);
  while( true ) {
    local_f8.field_1.field_0.line = 0;
    local_f8.field_1._4_8_ = 0;
    local_f8.filename.data_ = (char *)0x0;
    local_f8.filename.size_._0_4_ = 0;
    local_f8.filename.size_._4_4_ = 0;
    Var::Var(&local_78,0xffffffff,&local_f8);
    bVar1 = ParseVarOpt(this,&var,&local_78);
    Var::~Var(&local_78);
    if (!bVar1) break;
    std::vector<wabt::Var,std::allocator<wabt::Var>>::emplace_back<wabt::Var&>
              ((vector<wabt::Var,std::allocator<wabt::Var>> *)out_var_list,&var);
  }
  RVar2.enum_ = Ok;
  if ((out_var_list->super__Vector_base<wabt::Var,_std::allocator<wabt::Var>_>)._M_impl.
      super__Vector_impl_data._M_start ==
      (out_var_list->super__Vector_base<wabt::Var,_std::allocator<wabt::Var>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string((string *)&local_f8,"a var",&local_f9);
    local_d8 = 0;
    uStack_d0 = 0;
    local_c8 = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_d8,
               &local_f8,&local_d8);
    RVar2 = ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&local_d8,"12 or $foo");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_d8);
    std::__cxx11::string::_M_dispose();
  }
  Var::~Var(&var);
  return (Result)RVar2.enum_;
}

Assistant:

Result WastParser::ParseVarList(VarVector* out_var_list) {
  WABT_TRACE(ParseVarList);
  Var var;
  while (ParseVarOpt(&var)) {
    out_var_list->emplace_back(var);
  }
  if (out_var_list->empty()) {
    return ErrorExpected({"a var"}, "12 or $foo");
  } else {
    return Result::Ok;
  }
}